

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.cpp
# Opt level: O1

void __thiscall tlx::SpacingLogger::SpacingLogger(SpacingLogger *this)

{
  this->first_ = true;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&this->oss_);
  if (s_logger_prefix_hook != (long *)0x0) {
    (**(code **)(*s_logger_prefix_hook + 0x10))(s_logger_prefix_hook,&this->oss_);
  }
  return;
}

Assistant:

SpacingLogger::SpacingLogger() {
    LoggerPrefixHook* prefix_hook = s_logger_prefix_hook.load();
    if (prefix_hook)
        prefix_hook->add_log_prefix(oss_);
}